

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutTests.cpp
# Opt level: O0

void __thiscall
agge::tests::LayoutTests::SingleLineUnboundLayoutProducesSingleGlyphRuns(LayoutTests *this)

{
  element_type *peVar1;
  __normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
  end;
  glyph *local_ca0;
  allocator local_bd9;
  string local_bd8;
  LocationInfo local_bb8;
  text_line *local_b90;
  text_line *local_b88;
  vector<agge::text_line,_std::allocator<agge::text_line>_> local_b80;
  undefined1 local_b68 [72];
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_b20;
  ref_text_line local_b08;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_ae0;
  allocator local_ac1;
  string local_ac0;
  LocationInfo local_aa0;
  text_line *local_a78;
  text_line *local_a70;
  vector<agge::text_line,_std::allocator<agge::text_line>_> local_a68;
  undefined1 local_a50 [72];
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_a08;
  ref_text_line local_9f0;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_9c8;
  allocator local_9a9;
  string local_9a8;
  LocationInfo local_988;
  text_line *local_960;
  text_line *local_958;
  vector<agge::text_line,_std::allocator<agge::text_line>_> local_950;
  undefined1 local_938 [72];
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_8f0;
  ref_text_line local_8d8;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_8b0;
  allocator local_891;
  string local_890;
  LocationInfo local_870;
  text_line *local_848;
  text_line *local_840;
  vector<agge::text_line,_std::allocator<agge::text_line>_> local_838;
  undefined1 local_820 [72];
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_7d8;
  ref_text_line local_7c0;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_798;
  allocator local_779;
  string local_778;
  LocationInfo local_758;
  text_line *local_730;
  text_line *local_728;
  vector<agge::text_line,_std::allocator<agge::text_line>_> local_720;
  undefined1 local_708 [72];
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_6c0;
  ref_text_line local_6a8;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_680;
  undefined1 auStack_668 [8];
  positioned_glyph reference5 [9];
  positioned_glyph reference4 [1];
  positioned_glyph reference3 [3];
  undefined1 auStack_5b8 [8];
  positioned_glyph reference2 [3];
  undefined1 local_588 [8];
  positioned_glyph reference1 [1];
  richtext_t local_558;
  allocator local_4e9;
  string local_4e8;
  richtext_t local_4c8;
  allocator local_459;
  string local_458;
  richtext_t local_438;
  allocator local_3c9;
  string local_3c8;
  richtext_t local_3a8;
  allocator local_339;
  string local_338;
  richtext_t local_318;
  undefined1 local_2b0 [8];
  layout l5;
  layout l4;
  layout l3;
  layout l2;
  layout l1;
  const_iterator gr;
  factory_ptr f2;
  undefined1 local_f8 [8];
  factory_ptr f1;
  glyph glyphs [4];
  char_to_index indices2 [4];
  char_to_index indices1 [3];
  LayoutTests *this_local;
  
  indices2[3].symbol = 0x41;
  indices2[3].index = 1;
  indices2[1].symbol = 0x51;
  indices2[1].index = 2;
  indices2[2].symbol = 0x20;
  indices2[2].index = 3;
  glyphs[3].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x41;
  indices2[0].symbol = 0x42;
  indices2[0].index = 1;
  f1.super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x402a000000000000;
  glyphs[0].metrics.dx = 0.0;
  glyphs[0].metrics.dy = 0.0;
  glyphs[0].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  glyphs[0].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::vector
            ((vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *)
             &glyphs[0].metrics.dy);
  glyphs[0].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x4026000000000000;
  glyphs[1].metrics.dx = 0.0;
  glyphs[1].metrics.dy = 0.0;
  glyphs[1].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  glyphs[1].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::vector
            ((vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *)
             &glyphs[1].metrics.dy);
  glyphs[1].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x4029666666666666;
  glyphs[2].metrics.dx = 0.0;
  glyphs[2].metrics.dy = 0.0;
  glyphs[2].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  glyphs[2].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::vector
            ((vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *)
             &glyphs[2].metrics.dy);
  glyphs[2].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x4024333333333333;
  glyphs[3].metrics.dx = 0.0;
  glyphs[3].metrics.dy = 0.0;
  glyphs[3].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  glyphs[3].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::vector
            ((vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *)
             &glyphs[3].metrics.dy);
  create_single_font_factory<3ul,4ul>
            ((LayoutTests *)local_f8,(font_metrics *)this,
             (char_to_index (*) [3])(anonymous_namespace)::c_fm1,(glyph (*) [4])(indices2 + 3));
  end._M_current =
       (text_line *)
       &glyphs[3].outline.
        super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage;
  create_single_font_factory<4ul,4ul>
            ((LayoutTests *)&gr,(font_metrics *)this,
             (char_to_index (*) [4])(anonymous_namespace)::c_fm2,(glyph (*) [4])end._M_current);
  __gnu_cxx::
  __normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
  ::__normal_iterator((__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
                       *)&l1._box);
  layout::layout((layout *)&l2._box);
  layout::layout((layout *)&l3._box);
  layout::layout((layout *)&l4._box);
  layout::layout((layout *)&l5._box);
  layout::layout((layout *)local_2b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_338,"A",&local_339);
  R(&local_318,&local_338);
  peVar1 = std::
           __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_f8);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            ((layout *)&l2._box,&local_318,peVar1);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&local_318);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3c8,"AAB",&local_3c9);
  R(&local_3a8,&local_3c8);
  peVar1 = std::
           __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_f8);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            ((layout *)&l3._box,&local_3a8,peVar1);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&local_3a8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_458,"BQA",&local_459);
  R(&local_438,&local_458);
  peVar1 = std::
           __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_f8);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            ((layout *)&l4._box,&local_438,peVar1);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&local_438);
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4e8,"A",&local_4e9);
  R(&local_4c8,&local_4e8);
  peVar1 = std::
           __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&gr);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            ((layout *)&l5._box,&local_4c8,peVar1);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&local_4c8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&reference1[0].d.dy,"ABQ A  QA",(allocator *)((long)&reference1[0].d.dx + 3))
  ;
  R(&local_558,(string *)&reference1[0].d.dy);
  peVar1 = std::
           __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&gr);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            ((layout *)local_2b0,&local_558,peVar1);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&local_558);
  std::__cxx11::string::~string((string *)&reference1[0].d.dy);
  std::allocator<char>::~allocator((allocator<char> *)((long)&reference1[0].d.dx + 3));
  local_588._0_4_ = 1;
  local_588._4_4_ = 11.0;
  reference1[0].index = 0;
  reference2[2].index = 0;
  auStack_5b8._0_4_ = 1;
  auStack_5b8._4_4_ = 11.0;
  reference2[0].index = 0;
  reference2[0].d.dx = 1.4013e-45;
  reference2[0].d.dy = 11.0;
  reference2[1].index = 0;
  reference2[1].d.dx = 0.0;
  reference2[1].d.dy = 13.0;
  stack0xfffffffffffffa18 = 0x4150000000000000;
  stack0xfffffffffffffa08 = 0x4150000000000000;
  reference4[0].index = 0;
  reference5[7].d.dx = 0.0;
  reference5[7].d.dy = 13.0;
  reference5[8].index = 0;
  reference5[6].index = 0;
  reference5[6].d.dx = 2.8026e-45;
  reference5[6].d.dy = 12.7;
  reference5[7].index = 0;
  reference5[4].d.dy = 10.1;
  reference5[5].index = 0;
  reference5[5].d.dx = 4.2039e-45;
  reference5[5].d.dy = 10.1;
  reference5[3].d.dx = 0.0;
  reference5[3].d.dy = 13.0;
  reference5[4].index = 0;
  reference5[4].d.dx = 4.2039e-45;
  reference5[2].index = 0;
  reference5[2].d.dx = 4.2039e-45;
  reference5[2].d.dy = 10.1;
  reference5[3].index = 0;
  reference5[0].d.dy = 11.0;
  reference5[1].index = 0;
  reference5[1].d.dx = 2.8026e-45;
  reference5[1].d.dy = 12.7;
  auStack_668._0_4_ = 0;
  auStack_668._4_4_ = 13.0;
  reference5[0].index = 0;
  reference5[0].d.dx = 1.4013e-45;
  std::
  __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)local_f8);
  font_factory::operator*((font_factory *)local_708);
  ref_glyph_run::ref_glyph_run<1ul>
            ((ref_glyph_run *)(local_708 + 0x10),(shared_ptr<agge::font> *)local_708,0.0,0.0,
             (positioned_glyph (*) [1])local_588);
  plural_::operator+(&local_6c0,(plural_ *)&plural,(ref_glyph_run *)(local_708 + 0x10));
  ref_text_line::ref_text_line(&local_6a8,0.0,10.0,0.0,&local_6c0);
  plural_::operator+(&local_680,(plural_ *)&plural,&local_6a8);
  local_728 = (text_line *)layout::begin((layout *)&l2._box);
  local_730 = (text_line *)layout::end((layout *)&l2._box);
  mkvector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>>
            (&local_720,(tests *)local_728,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_730,end);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_778,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,&local_779);
  ut::LocationInfo::LocationInfo(&local_758,&local_778,0xa5);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_680,&local_720,&local_758);
  ut::LocationInfo::~LocationInfo(&local_758);
  std::__cxx11::string::~string((string *)&local_778);
  std::allocator<char>::~allocator((allocator<char> *)&local_779);
  std::vector<agge::text_line,_std::allocator<agge::text_line>_>::~vector(&local_720);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_680);
  ref_text_line::~ref_text_line(&local_6a8);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_6c0);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)(local_708 + 0x10));
  std::shared_ptr<agge::font>::~shared_ptr((shared_ptr<agge::font> *)local_708);
  std::
  __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)local_f8);
  font_factory::operator*((font_factory *)local_820);
  ref_glyph_run::ref_glyph_run<3ul>
            ((ref_glyph_run *)(local_820 + 0x10),(shared_ptr<agge::font> *)local_820,0.0,0.0,
             (positioned_glyph (*) [3])auStack_5b8);
  plural_::operator+(&local_7d8,(plural_ *)&plural,(ref_glyph_run *)(local_820 + 0x10));
  ref_text_line::ref_text_line(&local_7c0,0.0,10.0,0.0,&local_7d8);
  plural_::operator+(&local_798,(plural_ *)&plural,&local_7c0);
  local_840 = (text_line *)layout::begin((layout *)&l3._box);
  local_848 = (text_line *)layout::end((layout *)&l3._box);
  mkvector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>>
            (&local_838,(tests *)local_840,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_848,end);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_890,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,&local_891);
  ut::LocationInfo::LocationInfo(&local_870,&local_890,0xa8);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_798,&local_838,&local_870);
  ut::LocationInfo::~LocationInfo(&local_870);
  std::__cxx11::string::~string((string *)&local_890);
  std::allocator<char>::~allocator((allocator<char> *)&local_891);
  std::vector<agge::text_line,_std::allocator<agge::text_line>_>::~vector(&local_838);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_798);
  ref_text_line::~ref_text_line(&local_7c0);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_7d8);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)(local_820 + 0x10));
  std::shared_ptr<agge::font>::~shared_ptr((shared_ptr<agge::font> *)local_820);
  std::
  __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)local_f8);
  font_factory::operator*((font_factory *)local_938);
  ref_glyph_run::ref_glyph_run<3ul>
            ((ref_glyph_run *)(local_938 + 0x10),(shared_ptr<agge::font> *)local_938,0.0,0.0,
             (positioned_glyph (*) [3])&reference4[0].d.dy);
  plural_::operator+(&local_8f0,(plural_ *)&plural,(ref_glyph_run *)(local_938 + 0x10));
  ref_text_line::ref_text_line(&local_8d8,0.0,10.0,0.0,&local_8f0);
  plural_::operator+(&local_8b0,(plural_ *)&plural,&local_8d8);
  local_958 = (text_line *)layout::begin((layout *)&l4._box);
  local_960 = (text_line *)layout::end((layout *)&l4._box);
  mkvector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>>
            (&local_950,(tests *)local_958,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_960,end);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_9a8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,&local_9a9);
  ut::LocationInfo::LocationInfo(&local_988,&local_9a8,0xab);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_8b0,&local_950,&local_988);
  ut::LocationInfo::~LocationInfo(&local_988);
  std::__cxx11::string::~string((string *)&local_9a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9a9);
  std::vector<agge::text_line,_std::allocator<agge::text_line>_>::~vector(&local_950);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_8b0);
  ref_text_line::~ref_text_line(&local_8d8);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_8f0);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)(local_938 + 0x10));
  std::shared_ptr<agge::font>::~shared_ptr((shared_ptr<agge::font> *)local_938);
  std::
  __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)&gr);
  font_factory::operator*((font_factory *)local_a50);
  ref_glyph_run::ref_glyph_run<1ul>
            ((ref_glyph_run *)(local_a50 + 0x10),(shared_ptr<agge::font> *)local_a50,0.0,0.0,
             (positioned_glyph (*) [1])&reference5[8].d.dy);
  plural_::operator+(&local_a08,(plural_ *)&plural,(ref_glyph_run *)(local_a50 + 0x10));
  ref_text_line::ref_text_line(&local_9f0,0.0,14.0,0.0,&local_a08);
  plural_::operator+(&local_9c8,(plural_ *)&plural,&local_9f0);
  local_a70 = (text_line *)layout::begin((layout *)&l5._box);
  local_a78 = (text_line *)layout::end((layout *)&l5._box);
  mkvector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>>
            (&local_a68,(tests *)local_a70,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_a78,end);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_ac0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,&local_ac1);
  ut::LocationInfo::LocationInfo(&local_aa0,&local_ac0,0xae);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_9c8,&local_a68,&local_aa0);
  ut::LocationInfo::~LocationInfo(&local_aa0);
  std::__cxx11::string::~string((string *)&local_ac0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ac1);
  std::vector<agge::text_line,_std::allocator<agge::text_line>_>::~vector(&local_a68);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_9c8);
  ref_text_line::~ref_text_line(&local_9f0);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_a08);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)(local_a50 + 0x10));
  std::shared_ptr<agge::font>::~shared_ptr((shared_ptr<agge::font> *)local_a50);
  std::
  __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)&gr);
  font_factory::operator*((font_factory *)local_b68);
  ref_glyph_run::ref_glyph_run<9ul>
            ((ref_glyph_run *)(local_b68 + 0x10),(shared_ptr<agge::font> *)local_b68,0.0,0.0,
             (positioned_glyph (*) [9])auStack_668);
  plural_::operator+(&local_b20,(plural_ *)&plural,(ref_glyph_run *)(local_b68 + 0x10));
  ref_text_line::ref_text_line(&local_b08,0.0,14.0,0.0,&local_b20);
  plural_::operator+(&local_ae0,(plural_ *)&plural,&local_b08);
  local_b88 = (text_line *)layout::begin((layout *)local_2b0);
  local_b90 = (text_line *)layout::end((layout *)local_2b0);
  mkvector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>>
            (&local_b80,(tests *)local_b88,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_b90,end);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_bd8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,&local_bd9);
  ut::LocationInfo::LocationInfo(&local_bb8,&local_bd8,0xb1);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_ae0,&local_b80,&local_bb8);
  ut::LocationInfo::~LocationInfo(&local_bb8);
  std::__cxx11::string::~string((string *)&local_bd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_bd9);
  std::vector<agge::text_line,_std::allocator<agge::text_line>_>::~vector(&local_b80);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_ae0);
  ref_text_line::~ref_text_line(&local_b08);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_b20);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)(local_b68 + 0x10));
  std::shared_ptr<agge::font>::~shared_ptr((shared_ptr<agge::font> *)local_b68);
  layout::~layout((layout *)local_2b0);
  layout::~layout((layout *)&l5._box);
  layout::~layout((layout *)&l4._box);
  layout::~layout((layout *)&l3._box);
  layout::~layout((layout *)&l2._box);
  std::shared_ptr<agge::tests::LayoutTests::font_factory>::~shared_ptr
            ((shared_ptr<agge::tests::LayoutTests::font_factory> *)&gr);
  std::shared_ptr<agge::tests::LayoutTests::font_factory>::~shared_ptr
            ((shared_ptr<agge::tests::LayoutTests::font_factory> *)local_f8);
  local_ca0 = (glyph *)&glyphs[3].outline.
                        super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  do {
    local_ca0 = local_ca0 + -1;
    mocks::font_accessor::glyph::~glyph(local_ca0);
  } while (local_ca0 !=
           (glyph *)&f1.
                     super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount);
  return;
}

Assistant:

test( SingleLineUnboundLayoutProducesSingleGlyphRuns )
			{
				// INIT
				mocks::font_accessor::char_to_index indices1[] = { { L'A', 1 }, { L'B', 0 }, { L'Q', 0 }, };
				mocks::font_accessor::char_to_index indices2[] = { { L'A', 0 }, { L'B', 1 }, { L'Q', 2 }, { L' ', 3 } };
				mocks::font_accessor::glyph glyphs[] = {
					{ { 13, 0 } },
					{ { 11, 0 } },
					{ { 12.7, 0 } },
					{ { 10.1, 0 } },
				};
				factory_ptr f1 = create_single_font_factory(c_fm1, indices1, glyphs);
				factory_ptr f2 = create_single_font_factory(c_fm2, indices2, glyphs);
				layout::const_iterator gr;

				// INIT / ACT
				layout l1;
				layout l2;
				layout l3;
				layout l4;
				layout l5;

				l1.process(R("A"), limit::none(), *f1);
				l2.process(R("AAB"), limit::none(), *f1);
				l3.process(R("BQA"), limit::none(), *f1);
				l4.process(R("A"), limit::none(), *f2);
				l5.process(R("ABQ A  QA"), limit::none(), *f2);

				// ASSERT
				positioned_glyph reference1[] = { { 1, { 11.0f, 0.0f } } };
				positioned_glyph reference2[] = { { 1, { 11.0f, 0.0f } }, { 1, { 11.0f, 0.0f } }, { 0, { 13.0f, 0.0f } }, };
				positioned_glyph reference3[] = { { 0, { 13.0f, 0.0f } }, { 0, { 13.0f, 0.0f } }, { 1, { 11.0f, 0.0f } }, };
				positioned_glyph reference4[] = { { 0, { 13.0f, 0.0f } }, };
				positioned_glyph reference5[] = {
					{ 0, { 13.0f, 0.0f } },
					{ 1, { 11.0f, 0.0f } },
					{ 2, { 12.7f, 0.0f } },
					{ 3, { 10.1f, 0.0f } },
					{ 0, { 13.0f, 0.0f } },
					{ 3, { 10.1f, 0.0f } },
					{ 3, { 10.1f, 0.0f } },
					{ 2, { 12.7f, 0.0f } },
					{ 0, { 13.0f, 0.0f } },
				};

				assert_equal(plural + ref_text_line(0.0f, 10.0f, 0.0f, plural + ref_glyph_run(**f1, 0.0f, 0.0f, reference1)),
					mkvector(l1.begin(), l1.end()));

				assert_equal(plural + ref_text_line(0.0f, 10.0f, 0.0f, plural + ref_glyph_run(**f1, 0.0f, 0.0f, reference2)),
					mkvector(l2.begin(), l2.end()));

				assert_equal(plural + ref_text_line(0.0f, 10.0f, 0.0f, plural + ref_glyph_run(**f1, 0.0f, 0.0f, reference3)),
					mkvector(l3.begin(), l3.end()));

				assert_equal(plural + ref_text_line(0.0f, 14.0f, 0.0f, plural + ref_glyph_run(**f2, 0.0f, 0.0f, reference4)),
					mkvector(l4.begin(), l4.end()));

				assert_equal(plural + ref_text_line(0.0f, 14.0f, 0.0f, plural + ref_glyph_run(**f2, 0.0f, 0.0f, reference5)),
					mkvector(l5.begin(), l5.end()));
			}